

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O1

int __thiscall
axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::cmpIgnoreCase_pcu
          (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this,StringRef *string)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int unaff_EBX;
  uint uVar6;
  char cVar7;
  ulong uVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *pbVar11;
  
  uVar1 = this->m_length;
  uVar2 = string->m_length;
  uVar8 = uVar2;
  if (uVar1 < uVar2) {
    uVar8 = uVar1;
  }
  if (0 < (long)uVar8) {
    pbVar10 = (byte *)this->m_p;
    pbVar9 = pbVar10 + uVar8;
    pbVar11 = (byte *)string->m_p;
    do {
      iVar4 = tolower((uint)*pbVar10);
      iVar5 = tolower((uint)*pbVar11);
      cVar7 = (char)iVar4;
      cVar3 = (char)iVar5;
      if (cVar3 < cVar7) {
        unaff_EBX = 1;
      }
      if (cVar7 < cVar3) {
        unaff_EBX = -1;
      }
      if (cVar7 != cVar3) {
        return unaff_EBX;
      }
      pbVar10 = pbVar10 + 1;
      pbVar11 = pbVar11 + 1;
    } while (pbVar10 < pbVar9);
  }
  uVar6 = 0xffffffff;
  if (uVar2 <= uVar1) {
    uVar6 = (uint)(uVar2 < uVar1);
  }
  return uVar6;
}

Assistant:

int
	cmpIgnoreCase_pcu(const StringRef& string) const {
		size_t length = AXL_MIN(m_length, string.m_length);

		const C* p1 = m_p;
		const C* p2 = string.m_p;
		const C* end = p1 + length;
		for (; p1 < end; p1++, p2++) {
			C c1 = Details::toLower(*p1);
			C c2 = Details::toLower(*p2);

			if (c1 < c2)
				return -1;
			else if (c1 > c2)
				return 1;
		}

		return
			m_length < string.m_length ? -1 :
			m_length > string.m_length ? 1 : 0;
	}